

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void process_init_field_designator
               (c2m_ctx_t c2m_ctx,node_t_conflict designator_member,type *container_type)

{
  VARR_init_object_t *pVVar1;
  VARR_node_t *pVVar2;
  void *pvVar3;
  ulong uVar4;
  node_t_conflict *ppnVar5;
  node_t_conflict pnVar6;
  init_object_t *piVar7;
  size_t sVar8;
  char *extraout_RDX;
  undefined4 unaff_EBP;
  anon_union_8_2_e4b0c9a5_for_u *paVar9;
  char *pcVar10;
  c2m_ctx_t c2m_ctx_00;
  pos_t p;
  
  if (designator_member->code == N_MEMBER) {
    pVVar1 = c2m_ctx->init_object_path;
    if (pVVar1 != (VARR_init_object_t *)0x0) {
      sVar8 = pVVar1->els_num;
      if (sVar8 != 0) {
        paVar9 = &pVVar1->varr[sVar8 - 1].u;
        do {
          sVar8 = sVar8 - 1;
          if (pVVar1->varr == (init_object_t *)0x0) goto LAB_0018a812;
          unaff_EBP = *(undefined4 *)((long)paVar9 + -4);
          if (((*(int *)(paVar9 + -1) == 0) || (paVar9->curr_member->attr == (void *)0x0)) ||
             (*(char *)(*(long *)((long)paVar9->curr_member->attr + 0x40) + 0x1d) == '\0')) break;
          container_type = ((init_object_t *)(paVar9 + -2))->container_type;
          pVVar1->els_num = sVar8;
          if (pVVar1 == (VARR_init_object_t *)0x0) goto LAB_0018a80d;
          paVar9 = paVar9 + -3;
        } while (sVar8 != 0);
      }
      if (c2m_ctx->containing_anon_members == (VARR_node_t *)0x0) {
        process_init_field_designator_cold_7();
LAB_0018a83b:
        __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)"
                     );
      }
      if (c2m_ctx->containing_anon_members->els_num != 0) goto LAB_0018a83b;
      pnVar6 = *(node_t_conflict *)((long)designator_member->attr + 0x48);
      while (pnVar6 != (node_t_conflict)0x0) {
        pVVar2 = c2m_ctx->containing_anon_members;
        if (pVVar2->varr == (node_t_conflict *)0x0) goto LAB_0018a808;
        pvVar3 = pnVar6->attr;
        uVar4 = pVVar2->els_num + 1;
        if (pVVar2->size < uVar4) {
          sVar8 = (uVar4 >> 1) + uVar4;
          ppnVar5 = (node_t_conflict *)realloc(pVVar2->varr,sVar8 * 8);
          pVVar2->varr = ppnVar5;
          pVVar2->size = sVar8;
        }
        sVar8 = pVVar2->els_num;
        pVVar2->els_num = sVar8 + 1;
        pVVar2->varr[sVar8] = pnVar6;
        pnVar6 = *(node_t_conflict *)((long)pvVar3 + 0x48);
      }
      while (pVVar2 = c2m_ctx->containing_anon_members, pVVar2 != (VARR_node_t *)0x0) {
        sVar8 = pVVar2->els_num;
        if (sVar8 == 0) {
          pcVar10 = (char *)0x0;
          pnVar6 = get_adjacent_member(designator_member,0);
          pVVar1 = c2m_ctx->init_object_path;
          c2m_ctx_00 = (c2m_ctx_t)pVVar1->varr;
          if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
            uVar4 = pVVar1->els_num + 1;
            if (pVVar1->size < uVar4) {
              sVar8 = (uVar4 >> 1) + uVar4;
              piVar7 = (init_object_t *)realloc(c2m_ctx_00,sVar8 * 0x18);
              pVVar1->varr = piVar7;
              pVVar1->size = sVar8;
            }
            sVar8 = pVVar1->els_num;
            piVar7 = pVVar1->varr;
            pVVar1->els_num = sVar8 + 1;
            piVar7[sVar8].container_type = container_type;
            piVar7[sVar8].field_designator_p = 1;
            *(undefined4 *)&piVar7[sVar8].field_0xc = unaff_EBP;
            piVar7[sVar8].u.curr_member = pnVar6;
            return;
          }
          process_init_field_designator_cold_5();
          pnVar6 = new_node(c2m_ctx_00,N_L);
          p.lno = (int)sVar8;
          p.ln_pos = (int)(sVar8 >> 0x20);
          p.fname = extraout_RDX;
          add_pos(c2m_ctx_00,pnVar6,p);
          (pnVar6->u).s.s = pcVar10;
          return;
        }
        if (pVVar2->varr == (node_t_conflict *)0x0) goto LAB_0018a7fe;
        pVVar2->els_num = sVar8 - 1;
        pVVar1 = c2m_ctx->init_object_path;
        if (pVVar1->varr == (init_object_t *)0x0) goto LAB_0018a803;
        pnVar6 = pVVar2->varr[sVar8 - 1];
        uVar4 = pVVar1->els_num + 1;
        if (pVVar1->size < uVar4) {
          sVar8 = (uVar4 >> 1) + uVar4;
          piVar7 = (init_object_t *)realloc(pVVar1->varr,sVar8 * 0x18);
          pVVar1->varr = piVar7;
          pVVar1->size = sVar8;
        }
        sVar8 = pVVar1->els_num;
        piVar7 = pVVar1->varr;
        pVVar1->els_num = sVar8 + 1;
        piVar7[sVar8].container_type = container_type;
        piVar7[sVar8].field_designator_p = 0;
        *(undefined4 *)&piVar7[sVar8].field_0xc = unaff_EBP;
        piVar7[sVar8].u.curr_member = pnVar6;
        container_type = *(type **)((long)pnVar6->attr + 0x40);
      }
      process_init_field_designator_cold_6();
LAB_0018a7fe:
      process_init_field_designator_cold_4();
LAB_0018a803:
      process_init_field_designator_cold_3();
LAB_0018a808:
      process_init_field_designator_cold_2();
    }
LAB_0018a80d:
    process_init_field_designator_cold_8();
LAB_0018a812:
    process_init_field_designator_cold_1();
  }
  __assert_fail("designator_member->code == N_MEMBER",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
}

Assistant:

static void process_init_field_designator (c2m_ctx_t c2m_ctx, node_t designator_member,
                                           struct type *container_type) {
  decl_t decl;
  init_object_t init_object;
  node_t curr_member;

  assert (designator_member->code == N_MEMBER);
  /* We can have *partial* path of containing anon members: pop them */
  while (VARR_LENGTH (init_object_t, init_object_path) != 0) {
    init_object = VARR_LAST (init_object_t, init_object_path);
    if (!init_object.field_designator_p || (decl = init_object.u.curr_member->attr) == NULL
        || !decl->decl_spec.type->unnamed_anon_struct_union_member_type_p) {
      break;
    }
    container_type = init_object.container_type;
    VARR_POP (init_object_t, init_object_path);
  }
  /* Now add *full* path to designator_member of containing anon members */
  assert (VARR_LENGTH (node_t, containing_anon_members) == 0);
  decl = designator_member->attr;
  for (curr_member = decl->containing_unnamed_anon_struct_union_member; curr_member != NULL;
       curr_member = decl->containing_unnamed_anon_struct_union_member) {
    decl = curr_member->attr;
    VARR_PUSH (node_t, containing_anon_members, curr_member);
  }
  while (VARR_LENGTH (node_t, containing_anon_members) != 0) {
    init_object.u.curr_member = VARR_POP (node_t, containing_anon_members);
    init_object.container_type = container_type;
    init_object.field_designator_p = FALSE;
    VARR_PUSH (init_object_t, init_object_path, init_object);
    container_type = (decl = init_object.u.curr_member->attr)->decl_spec.type;
  }
  init_object.u.curr_member = get_adjacent_member (designator_member, FALSE);
  init_object.container_type = container_type;
  init_object.field_designator_p = TRUE;
  VARR_PUSH (init_object_t, init_object_path, init_object);
}